

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

void __thiscall
cubeb_mixer::copy_and_trunc<float>
          (cubeb_mixer *this,size_t frames,float *input_buffer,float *output_buffer)

{
  undefined4 uVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  ulong in_RSI;
  float *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar2;
  uint local_28;
  uint local_24;
  undefined4 *local_20;
  undefined4 *local_18;
  
  if ((uint)in_RDI[6] < (uint)in_RDI[5]) {
    for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
      PodCopy<float>((float *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_RDI,0x14385b);
    }
  }
  else if ((in_RDI[5] == 1.4013e-45) && (1 < (uint)in_RDI[6])) {
    local_20 = in_RCX;
    local_18 = in_RDX;
    for (local_24 = 0; local_24 < in_RSI; local_24 = local_24 + 1) {
      uVar1 = *local_18;
      local_20[1] = uVar1;
      *local_20 = uVar1;
      PodZero<float>((float *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (size_t)in_RDI);
      local_20 = local_20 + (uint)in_RDI[6];
      local_18 = local_18 + 1;
    }
  }
  else {
    for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
      PodCopy<float>((float *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,
                     0x1437bd);
      PodZero<float>((float *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (size_t)in_RDI);
    }
  }
  return;
}

Assistant:

void copy_and_trunc(size_t frames,
                      const T * input_buffer,
                      T * output_buffer) const
  {
    if (_context._in_ch_count <= _context._out_ch_count) {
      // Not enough channels to copy, fill the gaps with silence.
      if (_context._in_ch_count == 1 && _context._out_ch_count >= 2) {
        // Special case for upmixing mono input to stereo and more. We will
        // duplicate the mono channel to the first two channels. On most system,
        // the first two channels are for left and right. It is commonly
        // expected that mono will on both left+right channels
        for (uint32_t i = 0; i < frames; i++) {
          output_buffer[0] = output_buffer[1] = *input_buffer;
          PodZero(output_buffer + 2, _context._out_ch_count - 2);
          output_buffer += _context._out_ch_count;
          input_buffer++;
        }
        return;
      }
      for (uint32_t i = 0; i < frames; i++) {
        PodCopy(output_buffer, input_buffer, _context._in_ch_count);
        output_buffer += _context._in_ch_count;
        input_buffer += _context._in_ch_count;
        PodZero(output_buffer, _context._out_ch_count - _context._in_ch_count);
        output_buffer += _context._out_ch_count - _context._in_ch_count;
      }
    } else {
      for (uint32_t i = 0; i < frames; i++) {
        PodCopy(output_buffer, input_buffer, _context._out_ch_count);
        output_buffer += _context._out_ch_count;
        input_buffer += _context._in_ch_count;
      }
    }
  }